

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxelizer.h
# Opt level: O0

float vx__triangle_area(vx_triangle_t *triangle)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float a2;
  float a1;
  float a0;
  vx_vertex_t ac;
  vx_vertex_t ab;
  vx_triangle_t *triangle_local;
  
  ac.field_0._4_8_ = *(undefined8 *)&(triangle->p2).field_0;
  fVar3 = (triangle->p2).field_0.v[2];
  _a1 = *(undefined8 *)&(triangle->p3).field_0;
  ac.field_0.v[0] = (triangle->p3).field_0.v[2];
  vx__vertex_sub((vx_vertex_t *)((long)&ac.field_0 + 4),&triangle->p1);
  vx__vertex_sub((vx_vertex_t *)&a1,&triangle->p1);
  fVar4 = ac.field_0.v[1] * ac.field_0.v[0];
  fVar1 = fVar3 * a1;
  fVar5 = ac.field_0.v[2] * a1;
  fVar2 = ac.field_0.v[1] * a0;
  fVar3 = powf(ac.field_0.v[2] * ac.field_0.v[0] + -(fVar3 * a0),2.0);
  fVar1 = powf(fVar1 + -fVar4,2.0);
  fVar2 = powf(fVar2 + -fVar5,2.0);
  fVar3 = sqrtf(fVar3 + fVar1 + fVar2);
  return fVar3 * 0.5;
}

Assistant:

float vx__triangle_area(vx_triangle_t* triangle) {
    vx_vertex_t ab = triangle->p2;
    vx_vertex_t ac = triangle->p3;

    vx__vertex_sub(&ab, &triangle->p1);
    vx__vertex_sub(&ac, &triangle->p1);

    float a0 = ab.y * ac.z - ab.z * ac.y;
    float a1 = ab.z * ac.x - ab.x * ac.z;
    float a2 = ab.x * ac.y - ab.y * ac.x;

    return sqrtf(powf(a0, 2.f) + powf(a1, 2.f) + powf(a2, 2.f)) * 0.5f;
}